

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::setupElementTransformWidget(Application *this)

{
  long lVar1;
  XFormWidget *this_00;
  Scene *in_RDI;
  bool isRoot;
  Joint *joint;
  XFormWidget *in_stack_00000270;
  long local_38;
  SceneObject *in_stack_fffffffffffffff0;
  Scene *pSVar2;
  
  this_00 = (XFormWidget *)(ulong)*(uint *)((long)&(in_RDI->hovered).element + 4);
  switch(this_00) {
  case (XFormWidget *)0x0:
    pSVar2 = in_RDI;
    DynamicScene::XFormWidget::exitObjectMode
              (*(XFormWidget **)((long)(in_RDI->selected).coordinates.z + 0x90));
    DynamicScene::XFormWidget::exitTransformedMode
              (*(XFormWidget **)((long)(in_RDI->selected).coordinates.z + 0x90));
    DynamicScene::XFormWidget::exitPoseMode
              (*(XFormWidget **)((long)(in_RDI->selected).coordinates.z + 0x90));
    if ((*(long *)((long)(in_RDI->selected).coordinates.z + 0x38) != 0) &&
       (*(long *)((long)(in_RDI->selected).coordinates.z + 0x30) !=
        *(long *)((long)(in_RDI->selected).coordinates.z + 0x90))) {
      DynamicScene::XFormWidget::setTarget(this_00,&in_RDI->hovered);
      DynamicScene::Scene::addObject(pSVar2,in_stack_fffffffffffffff0);
    }
    break;
  case (XFormWidget *)0x1:
  case (XFormWidget *)0x3:
    break;
  case (XFormWidget *)0x2:
    if (*(int *)&(in_RDI->hovered).coordinates.x == 6) {
      pSVar2 = in_RDI;
      DynamicScene::XFormWidget::exitObjectMode
                (*(XFormWidget **)((long)(in_RDI->selected).coordinates.z + 0x90));
      DynamicScene::XFormWidget::exitPoseMode
                (*(XFormWidget **)((long)(in_RDI->selected).coordinates.z + 0x90));
      DynamicScene::XFormWidget::enterTransformedMode
                (*(XFormWidget **)((long)(in_RDI->selected).coordinates.z + 0x90));
      if ((*(long *)((long)(in_RDI->selected).coordinates.z + 0x38) != 0) &&
         (*(long *)((long)(in_RDI->selected).coordinates.z + 0x30) !=
          *(long *)((long)(in_RDI->selected).coordinates.z + 0x90))) {
        DynamicScene::XFormWidget::setTarget(this_00,&in_RDI->hovered);
        DynamicScene::Scene::addObject(pSVar2,in_stack_fffffffffffffff0);
      }
    }
    else if (*(int *)&(in_RDI->hovered).coordinates.x == 7) {
      pSVar2 = in_RDI;
      DynamicScene::XFormWidget::enterObjectMode
                (*(XFormWidget **)((long)(in_RDI->selected).coordinates.z + 0x90));
      DynamicScene::XFormWidget::exitPoseMode
                (*(XFormWidget **)((long)(in_RDI->selected).coordinates.z + 0x90));
      DynamicScene::XFormWidget::exitTransformedMode
                (*(XFormWidget **)((long)(in_RDI->selected).coordinates.z + 0x90));
      if ((*(long *)((long)(in_RDI->selected).coordinates.z + 0x30) != 0) &&
         (*(long *)((long)(in_RDI->selected).coordinates.z + 0x30) !=
          *(long *)((long)(in_RDI->selected).coordinates.z + 0x90))) {
        DynamicScene::XFormWidget::setTarget(this_00,&in_RDI->hovered);
        DynamicScene::Scene::addObject(pSVar2,in_stack_fffffffffffffff0);
      }
    }
    else if (*(int *)&(in_RDI->hovered).coordinates.x == 8) {
      pSVar2 = in_RDI;
      DynamicScene::XFormWidget::enterObjectMode
                (*(XFormWidget **)((long)(in_RDI->selected).coordinates.z + 0x90));
      DynamicScene::XFormWidget::exitTransformedMode
                (*(XFormWidget **)((long)(in_RDI->selected).coordinates.z + 0x90));
      if ((*(long *)((long)(in_RDI->selected).coordinates.z + 0x30) != 0) &&
         (*(long *)((long)(in_RDI->selected).coordinates.z + 0x30) !=
          *(long *)((long)(in_RDI->selected).coordinates.z + 0x90))) {
        DynamicScene::XFormWidget::setTarget(this_00,&in_RDI->hovered);
        DynamicScene::Scene::addObject(pSVar2,in_stack_fffffffffffffff0);
        lVar1 = *(long *)((long)(in_RDI->selected).coordinates.z + 0x30);
        if (lVar1 == 0) {
          local_38 = 0;
        }
        else {
          local_38 = __dynamic_cast(lVar1,&DynamicScene::SceneObject::typeinfo,
                                    &DynamicScene::Joint::typeinfo,0);
        }
        if (local_38 == 0) {
          DynamicScene::XFormWidget::exitPoseMode
                    (*(XFormWidget **)((long)(in_RDI->selected).coordinates.z + 0x90));
        }
        else {
          lVar1 = *(long *)(*(long *)(local_38 + 0x140) + 0xf8);
          DynamicScene::XFormWidget::enterPoseMode
                    (*(XFormWidget **)((long)(in_RDI->selected).coordinates.z + 0x90));
          if (local_38 == lVar1) {
            DynamicScene::XFormWidget::setTranslate
                      (*(XFormWidget **)((long)(in_RDI->selected).coordinates.z + 0x90));
          }
          else {
            DynamicScene::XFormWidget::setRotate
                      (*(XFormWidget **)((long)(in_RDI->selected).coordinates.z + 0x90));
          }
        }
        DynamicScene::XFormWidget::updateGeometry(in_stack_00000270);
      }
    }
  }
  return;
}

Assistant:

void Application::setupElementTransformWidget() {
  switch (mode) {
    case RENDER_MODE:
    case VISUALIZE_MODE:
      break;
    case MODEL_MODE:
      scene->elementTransform->exitObjectMode();
      scene->elementTransform->exitTransformedMode();
      scene->elementTransform->exitPoseMode();
      if (scene->selected.element != nullptr  && scene->selected.object != scene->elementTransform) {
        scene->elementTransform->setTarget(scene->selected);
        scene->addObject(scene->elementTransform);
      }
      break;
    case ANIMATE_MODE:
      if (action == Action::Wave) {
        scene->elementTransform->exitObjectMode();
        scene->elementTransform->exitPoseMode();
        scene->elementTransform->enterTransformedMode();
        if (scene->selected.element != nullptr && scene->selected.object != scene->elementTransform) {
          scene->elementTransform->setTarget(scene->selected);
          scene->addObject(scene->elementTransform);
        }
      } else if (action == Action::Object) {
        scene->elementTransform->enterObjectMode();
        scene->elementTransform->exitPoseMode();
        scene->elementTransform->exitTransformedMode();
        if (scene->selected.object != nullptr && scene->selected.object != scene->elementTransform) {
          scene->elementTransform->setTarget(scene->selected);
          scene->addObject(scene->elementTransform);
        }
      } else if (action == Action::Pose) {
        scene->elementTransform->enterObjectMode();
        scene->elementTransform->exitTransformedMode();
        if (scene->selected.object != nullptr && scene->selected.object != scene->elementTransform) {
          scene->elementTransform->setTarget(scene->selected);
          scene->addObject(scene->elementTransform);

          DynamicScene::Joint *joint =
              dynamic_cast<DynamicScene::Joint *>(scene->selected.object);

          if (joint != nullptr) {
            bool isRoot = joint == joint->skeleton->root;
            scene->elementTransform->enterPoseMode();
            if (isRoot)
              // Only allow root translation
              scene->elementTransform->setTranslate();
            else
              // Other joints are only allowed to be rotated
              scene->elementTransform->setRotate();
          } else {
            scene->elementTransform->exitPoseMode();
          }

          scene->elementTransform->updateGeometry(); // enterPoseMode affects updateGeometry
        }
      }
      break;
  }
}